

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O2

QRect __thiscall
QStyleSheetStyle::subElementRect(QStyleSheetStyle *this,SubElement se,QStyleOption *opt,QWidget *w)

{
  QRect *pQVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  undefined4 uVar5;
  ulong uVar6;
  ulong uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  QStyleSheetStyle *pQVar12;
  undefined8 uVar13;
  bool bVar14;
  bool bVar15;
  QStyle *pQVar16;
  QStyleOptionProgressBar *pQVar17;
  QStyleOptionButton *pQVar18;
  QStyleOptionTab *pQVar19;
  QTabBar *this_00;
  QStyleOptionViewItem *pQVar20;
  QStyleOptionHeader *pQVar21;
  QSize QVar22;
  undefined8 uVar23;
  int iVar24;
  Alignment *pAVar25;
  LayoutDirection LVar26;
  QRenderRule *pQVar27;
  long lVar28;
  int iVar29;
  SubElement sr;
  long in_FS_OFFSET;
  QRect QVar30;
  undefined1 auVar31 [16];
  QFontMetrics local_2e0 [8];
  QRect local_2d8;
  undefined1 local_2c8 [12];
  Representation RStack_2bc;
  undefined1 *local_2b8;
  undefined1 *puStack_2b0;
  QStyleOptionButton btnOpt;
  QRenderRule subRule2_1;
  QRenderRule subRule;
  QRenderRule rule;
  
  pQVar12 = globalStyleSheetStyle;
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  if (globalStyleSheetStyle != (QStyleSheetStyle *)this &&
      globalStyleSheetStyle != (QStyleSheetStyle *)0x0) {
    pQVar16 = baseStyle(this);
    _local_2c8 = (QRect)(**(code **)(*(long *)pQVar16 + 0xc0))(pQVar16,se,opt,w);
    goto LAB_0035251a;
  }
  if (globalStyleSheetStyle == (QStyleSheetStyle *)0x0) {
    globalStyleSheetStyle = (QStyleSheetStyle *)this;
  }
  memset(&rule,0xaa,0x88);
  bVar14 = false;
  renderRule(&rule,this,&w->super_QObject,opt,0);
  iVar29 = 0x36;
  sr = SE_TabWidgetTabPane;
  pQVar18 = (QStyleOptionButton *)opt;
  switch(se) {
  case SE_PushButtonContents:
  case SE_PushButtonFocusRect:
  case SE_PushButtonBevel:
    pQVar18 = qstyleoption_cast<QStyleOptionButton_const*>(opt);
    if (pQVar18 == (QStyleOptionButton *)0x0) break;
    if ((((pQVar18->features).super_QFlagsStorageHelper<QStyleOptionButton::ButtonFeature,_4>.
          super_QFlagsStorage<QStyleOptionButton::ButtonFeature>.i & 2) != 0) &&
       (bVar14 = hasStyleRule(this,&w->super_QObject,7), bVar14)) {
      btnOpt.icon.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
      btnOpt.iconSize = (QSize)&DAT_aaaaaaaaaaaaaaaa;
      btnOpt.text.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      btnOpt.text.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      btnOpt._64_8_ = &DAT_aaaaaaaaaaaaaaaa;
      btnOpt.text.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      btnOpt.super_QStyleOption.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      btnOpt.super_QStyleOption.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
      btnOpt.super_QStyleOption._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
      btnOpt.super_QStyleOption.palette.d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
      btnOpt.super_QStyleOption.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      btnOpt.super_QStyleOption.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      btnOpt.super_QStyleOption._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      btnOpt.super_QStyleOption._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QStyleOptionButton::QStyleOptionButton(&btnOpt,pQVar18);
      btnOpt._64_8_ = btnOpt._64_8_ & 0xfffffffffffffffd;
      bVar14 = QRenderRule::baseStyleCanDraw(&rule);
      if (bVar14) {
        pQVar16 = baseStyle(this);
        _local_2c8 = (QRect)(**(code **)(*(long *)pQVar16 + 0xc0))(pQVar16,se,&btnOpt,w);
      }
      else {
        _local_2c8 = QWindowsStyle::subElementRect
                               ((QWindowsStyle *)this,se,&btnOpt.super_QStyleOption,w);
      }
      QStyleOptionButton::~QStyleOptionButton(&btnOpt);
      goto LAB_003524fd;
    }
    if ((rule.b.d.ptr != (QStyleSheetBoxData *)0x0) ||
       ((rule.bd.d.ptr != (QStyleSheetBorderData *)0x0 &&
        ((*(long *)((long)rule.bd.d.ptr + 0x68) != 0 ||
         (*(int *)((long)rule.bd.d.ptr + 0x38) != 0xc)))))) {
      LVar26 = opt->direction;
      if (se == SE_PushButtonBevel) {
        btnOpt.super_QStyleOption._0_16_ = QRenderRule::borderRect(&rule,&opt->rect);
      }
      else {
        btnOpt.super_QStyleOption._0_16_ = QRenderRule::contentsRect(&rule,&opt->rect);
      }
      goto LAB_00352291;
    }
    bVar14 = QRenderRule::baseStyleCanDraw(&rule);
    if (!bVar14) goto LAB_0035197c;
    pQVar16 = baseStyle(this);
    lVar28 = *(long *)pQVar16;
    goto LAB_00352416;
  case SE_CheckBoxIndicator:
  case SE_RadioButtonIndicator:
    if ((rule.bd.d.ptr != (QStyleSheetBorderData *)0x0 || rule.b.d.ptr != (QStyleSheetBoxData *)0x0)
       || (bVar14 = hasStyleRule(this,&w->super_QObject,5), bVar14)) {
      iVar29 = (se != SE_CheckBoxIndicator) + 5;
      memset((QRenderRule *)&btnOpt,0xaa,0x88);
      renderRule((QRenderRule *)&btnOpt,this,&w->super_QObject,opt,iVar29);
      LVar26 = opt->direction;
      goto LAB_00351f65;
    }
    break;
  case SE_CheckBoxContents:
  case SE_RadioButtonContents:
    if ((rule.bd.d.ptr == (QStyleSheetBorderData *)0x0 && rule.b.d.ptr == (QStyleSheetBoxData *)0x0)
       && (bVar14 = hasStyleRule(this,&w->super_QObject,5), !bVar14)) break;
    uVar5 = 0x43;
    if (se == SE_RadioButtonContents) {
      uVar5 = 0x4a;
    }
    btnOpt.super_QStyleOption._0_16_ =
         (**(code **)(*(long *)this + 0xc0))
                   (this,(se == SE_RadioButtonContents) * '\x04' + '\x02',opt,w);
    btnOpt.super_QStyleOption._0_16_ =
         QStyle::visualRect(opt->direction,&opt->rect,(QRect *)&btnOpt);
    iVar29 = (**(code **)(*(long *)this + 0xe0))(this,uVar5,0,w);
    QVar30 = QRenderRule::contentsRect(&rule,&opt->rect);
    iVar24 = (int)btnOpt.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                  super_QFlagsStorage<QStyle::StateFlag>.i + 1 + btnOpt.super_QStyleOption.version;
    btnOpt.super_QStyleOption.type = QVar30.y1.m_i.m_i;
    btnOpt.super_QStyleOption.version =
         (int)btnOpt.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
              super_QFlagsStorage<QStyle::StateFlag>.i + iVar29 + 1;
    btnOpt.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
    super_QFlagsStorage<QStyle::StateFlag>.i =
         (QFlagsStorageHelper<QStyle::StateFlag,_4>)
         (QFlagsStorageHelper<QStyle::StateFlag,_4>)
         (((iVar24 + QVar30.x2.m_i.m_i) - QVar30.x1.m_i) +
         ~(uint)btnOpt.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                super_QFlagsStorage<QStyle::StateFlag>.i);
    btnOpt.super_QStyleOption.direction = QVar30.y2.m_i.m_i;
    LVar26 = opt->direction;
LAB_00352291:
    _local_2c8 = QStyle::visualRect(LVar26,&opt->rect,(QRect *)&btnOpt);
    goto LAB_003524fd;
  case SE_CheckBoxFocusRect:
  case SE_CheckBoxClickRect:
switchD_00351726_caseD_4:
    goto LAB_0035197c;
  case SE_RadioButtonFocusRect:
  case SE_RadioButtonClickRect:
    if ((rule.bd.d.ptr != (QStyleSheetBorderData *)0x0 || rule.b.d.ptr != (QStyleSheetBoxData *)0x0)
       || (bVar14 = hasStyleRule(this,&w->super_QObject,5), bVar14)) {
LAB_00351949:
      _local_2c8 = opt->rect;
      goto LAB_003524fd;
    }
    break;
  case SE_ProgressBarGroove:
  case SE_ProgressBarContents:
  case SE_ProgressBarLabel:
    pQVar17 = qstyleoption_cast<QStyleOptionProgressBar_const*>(opt);
    if ((pQVar17 != (QStyleOptionProgressBar *)0x0) &&
       ((((rule.b.d.ptr != (QStyleSheetBoxData *)0x0 ||
          ((rule.bd.d.ptr != (QStyleSheetBorderData *)0x0 &&
           ((*(long *)((long)rule.bd.d.ptr + 0x68) != 0 ||
            (*(int *)((long)rule.bd.d.ptr + 0x38) != 0xc)))))) ||
         (rule.p.d.ptr != (QStyleSheetPositionData *)0x0)) ||
        (bVar14 = hasStyleRule(this,&w->super_QObject,0x2d), bVar14)))) {
      if (se == SE_ProgressBarContents) {
        _local_2c8 = QRenderRule::contentsRect(&rule,&(pQVar17->super_QStyleOption).rect);
      }
      else if (se == SE_ProgressBarGroove) {
        _local_2c8 = QRenderRule::borderRect(&rule,&(pQVar17->super_QStyleOption).rect);
      }
      else {
        uVar23 = QFontMetrics::size((int)pQVar17 + 0x20,(QString *)0x0,(int)pQVar17 + 0x50,
                                    (int *)0x0);
        btnOpt.super_QStyleOption.version = (int)uVar23;
        btnOpt.super_QStyleOption.type = (int)((ulong)uVar23 >> 0x20);
        pAVar25 = &pQVar17->textAlignment;
        if (rule.p.d.ptr != (QStyleSheetPositionData *)0x0) {
          pAVar25 = (Alignment *)((long)rule.p.d.ptr + 0x20);
        }
        _local_2c8 = QStyle::alignedRect(LeftToRight,
                                         (Alignment)
                                         (pAVar25->super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>).
                                         super_QFlagsStorage<Qt::AlignmentFlag>.i,(QSize *)&btnOpt,
                                         &(pQVar17->super_QStyleOption).rect);
      }
      goto LAB_003524fd;
    }
    break;
  case SE_ToolBoxTabContents:
    if ((w != (QWidget *)0x0) &&
       (bVar14 = hasStyleRule(this,*(QObject **)(*(long *)&w->field_0x8 + 0x10),0x14), bVar14)) {
      memset((QRenderRule *)&btnOpt,0xaa,0x88);
      renderRule((QRenderRule *)&btnOpt,this,*(QObject **)(*(long *)&w->field_0x8 + 0x10),opt,0x14);
      LVar26 = opt->direction;
      subRule._0_16_ = QRenderRule::contentsRect((QRenderRule *)&btnOpt,&opt->rect);
      _local_2c8 = QStyle::visualRect(LVar26,&opt->rect,(QRect *)&subRule);
      goto LAB_00351f6d;
    }
    break;
  case SE_HeaderLabel:
    memset((QRenderRule *)&btnOpt,0xaa,0x88);
    renderRule((QRenderRule *)&btnOpt,this,&w->super_QObject,opt,0x2a);
    if ((btnOpt.super_QStyleOption.styleObject != (QObject *)0x0) ||
       ((btnOpt.text.d.d != (Data *)0x0 &&
        ((btnOpt.text.d.d[6].super_QArrayData.alloc != 0 ||
         ((int)btnOpt.text.d.d[3].super_QArrayData.alloc != 0xc)))))) {
      stack0xfffffffffffffd40 = &DAT_aaaaaaaaaaaaaaaa;
      local_2c8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      _local_2c8 = QRenderRule::contentsRect((QRenderRule *)&btnOpt,&opt->rect);
      pQVar21 = qstyleoption_cast<QStyleOptionHeader_const*>(opt);
      if ((pQVar21 != (QStyleOptionHeader *)0x0) && (pQVar21->sortIndicator != None)) {
        auVar31 = (**(code **)(*(long *)this + 0xc0))(this,0x11,opt,w);
        if (auVar31._4_4_ <= auVar31._12_4_ && auVar31._0_4_ <= auVar31._8_4_) {
          bVar14 = -1 < (char)(opt->state).super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                              super_QFlagsStorage<QStyle::StateFlag>.i;
          uVar6 = auVar31._8_8_ >> 0x20;
          if (!bVar14) {
            uVar6 = auVar31._8_8_;
          }
          uVar7 = auVar31._0_8_ >> 0x20;
          if (!bVar14) {
            uVar7 = auVar31._0_8_;
          }
          *(uint *)(local_2c8 + (ulong)bVar14 * 4 + 8) =
               *(int *)(local_2c8 + (ulong)bVar14 * 4 + 8) + ~(uint)uVar6 + (int)uVar7;
        }
      }
      goto LAB_00352060;
    }
LAB_003523f4:
    pQVar27 = (QRenderRule *)&btnOpt;
LAB_003523f9:
    QRenderRule::~QRenderRule(pQVar27);
    break;
  case SE_HeaderArrow:
    memset((QRenderRule *)&btnOpt,0xaa,0x88);
    renderRule((QRenderRule *)&btnOpt,this,&w->super_QObject,opt,0x2b);
    if (btnOpt.text.d.size == 0 && btnOpt.icon.d == (QIconPrivate *)0x0) goto LAB_003523f4;
    LVar26 = opt->direction;
    iVar29 = 0x2b;
LAB_00351f65:
    _local_2c8 = positionRect(this,w,&rule,(QRenderRule *)&btnOpt,iVar29,&opt->rect,LVar26);
LAB_00351f6d:
    pQVar27 = (QRenderRule *)&btnOpt;
    goto LAB_003524f8;
  case SE_TabWidgetTabBar:
    iVar29 = 0x37;
    bVar14 = true;
    sr = se;
  case SE_TabWidgetTabPane:
  case SE_TabWidgetTabContents:
    goto switchD_00351726_caseD_13;
  case SE_TabWidgetLeftCorner:
    iVar29 = 0x38;
    goto LAB_00351f81;
  case SE_TabWidgetRightCorner:
    iVar29 = 0x39;
LAB_00351f81:
    bVar14 = false;
    sr = se;
switchD_00351726_caseD_13:
    bVar15 = hasStyleRule(this,&w->super_QObject,iVar29);
    if (bVar15) {
      stack0xfffffffffffffd40 = &DAT_aaaaaaaaaaaaaaaa;
      local_2c8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      _local_2c8 = QWindowsStyle::subElementRect((QWindowsStyle *)this,sr,opt,w);
      memset(&btnOpt,0xaa,0x88);
      renderRule((QRenderRule *)&btnOpt,this,&w->super_QObject,opt,iVar29);
      _local_2c8 = positionRect(this,w,(QRenderRule *)&btnOpt,iVar29,(QRect *)local_2c8,
                                opt->direction);
      if (bVar14) {
        _local_2c8 = (QRect)QRect::operator&(&opt->rect,(QRect *)local_2c8);
      }
      if (se == SE_TabWidgetTabContents) {
        _local_2c8 = QRenderRule::contentsRect((QRenderRule *)&btnOpt,(QRect *)local_2c8);
      }
LAB_00352060:
      pQVar27 = (QRenderRule *)&btnOpt;
      goto LAB_003524f8;
    }
    break;
  case SE_ItemViewItemCheckIndicator:
    pQVar20 = qstyleoption_cast<QStyleOptionViewItem_const*>(opt);
    if (pQVar20 == (QStyleOptionViewItem *)0x0) {
      _local_2c8 = (QRect)(**(code **)(*(long *)this + 0xc0))(this,2,opt,w);
      goto LAB_003524fd;
    }
  case SE_ItemViewItemDecoration:
  case SE_ItemViewItemText:
  case SE_ItemViewItemFocusRect:
    pQVar20 = qstyleoption_cast<QStyleOptionViewItem_const*>(opt);
    if (pQVar20 == (QStyleOptionViewItem *)0x0) break;
    memset(&subRule,0xaa,0x88);
    renderRule(&subRule,this,&w->super_QObject,opt,0x4a);
    if ((se & ~SE_PushButtonFocusRect) == SE_ItemViewItemText) {
      iVar29 = 0x4c;
LAB_00351cd9:
      if ((subRule.b.d.ptr != (QStyleSheetBoxData *)0x0 ||
           subRule.geo.d.ptr != (QStyleSheetGeometryData *)0x0) ||
         (((subRule.bd.d.ptr != (QStyleSheetBorderData *)0x0 &&
           ((*(long *)((long)subRule.bd.d.ptr + 0x68) != 0 ||
            (*(int *)((long)subRule.bd.d.ptr + 0x38) != 0xc)))) ||
          (bVar14 = hasStyleRule(this,&w->super_QObject,iVar29), bVar14)))) {
        memset(&subRule2_1,0xaa,0x88);
        renderRule(&subRule2_1,this,&w->super_QObject,opt,iVar29);
        memset((QStyleOptionViewItem *)&btnOpt,0xaa,0xd0);
        QStyleOptionViewItem::QStyleOptionViewItem((QStyleOptionViewItem *)&btnOpt,pQVar20);
        btnOpt.super_QStyleOption.rect =
             QRenderRule::contentsRect(&subRule,&(pQVar20->super_QStyleOption).rect);
        local_2d8 = QWindowsStyle::subElementRect
                              ((QWindowsStyle *)this,se,(QStyleOption *)&btnOpt,w);
        _local_2c8 = positionRect(this,w,&subRule2_1,iVar29,&local_2d8,opt->direction);
        QStyleOptionViewItem::~QStyleOptionViewItem((QStyleOptionViewItem *)&btnOpt);
        QRenderRule::~QRenderRule(&subRule2_1);
        bVar14 = true;
        goto LAB_00352399;
      }
      bVar14 = false;
      bVar15 = true;
    }
    else {
      bVar14 = false;
      if (se == SE_ItemViewItemCheckIndicator) {
        if (((pQVar20->features).super_QFlagsStorageHelper<QStyleOptionViewItem::ViewItemFeature,_4>
             .super_QFlagsStorage<QStyleOptionViewItem::ViewItemFeature>.i & 4) != 0) {
          iVar29 = 0x4d;
          goto LAB_00351cd9;
        }
      }
      else if ((se == SE_ItemViewItemDecoration) &&
              (((pQVar20->features).
                super_QFlagsStorageHelper<QStyleOptionViewItem::ViewItemFeature,_4>.
                super_QFlagsStorage<QStyleOptionViewItem::ViewItemFeature>.i & 0x10) != 0)) {
        iVar29 = 0x4b;
        goto LAB_00351cd9;
      }
LAB_00352399:
      bVar15 = false;
    }
    QRenderRule::~QRenderRule(&subRule);
    if ((bVar15) || (!bVar14)) break;
    goto LAB_003524fd;
  case SE_TabBarTearIndicator:
    memset((QRenderRule *)&btnOpt,0xaa,0x88);
    renderRule((QRenderRule *)&btnOpt,this,&w->super_QObject,opt,0x30);
    bVar14 = QRenderRule::hasContentsSize((QRenderRule *)&btnOpt);
    if (!bVar14) goto LAB_003523f4;
    _local_2c8 = (QRect)(ZEXT816(0xffffffffffffffff) << 0x40);
    pQVar19 = qstyleoption_cast<QStyleOptionTab_const*>(opt);
    if (pQVar19 != (QStyleOptionTab *)0x0) {
      if (pQVar19->shape < 8) {
        if ((0x33U >> (pQVar19->shape & 0x1f) & 1) == 0) {
          pQVar1 = &(pQVar19->super_QStyleOption).rect;
          iVar29 = (pQVar1->x1).m_i;
          iVar24 = (pQVar19->super_QStyleOption).rect.y1.m_i;
          uVar10 = pQVar1->x1;
          uVar11 = pQVar1->y1;
          local_2c8._4_4_ = uVar11;
          local_2c8._0_4_ = uVar10;
          uVar23 = local_2c8._0_8_;
          iVar2 = (opt->rect).x2.m_i;
          iVar3 = (opt->rect).x1.m_i;
          QVar22 = QRenderRule::size((QRenderRule *)&btnOpt);
          local_2c8._8_4_ = (iVar2 + iVar29) - iVar3;
          local_2c8 = CONCAT48(local_2c8._8_4_,uVar23);
          RStack_2bc.m_i = iVar24 + QVar22.ht.m_i.m_i + -1;
        }
        else {
          pQVar1 = &(pQVar19->super_QStyleOption).rect;
          iVar29 = (pQVar1->x1).m_i;
          iVar24 = (pQVar19->super_QStyleOption).rect.y1.m_i;
          uVar8 = pQVar1->x1;
          uVar9 = pQVar1->y1;
          local_2c8._4_4_ = uVar9;
          local_2c8._0_4_ = uVar8;
          uVar23 = local_2c8._0_8_;
          QVar22 = QRenderRule::size((QRenderRule *)&btnOpt);
          RStack_2bc.m_i = ((opt->rect).y2.m_i + iVar24) - (opt->rect).y1.m_i;
          local_2c8._8_4_ = QVar22.wd.m_i.m_i + iVar29 + -1;
          local_2c8 = CONCAT48(local_2c8._8_4_,uVar23);
        }
      }
      _local_2c8 = QStyle::visualRect(opt->direction,&opt->rect,(QRect *)local_2c8);
    }
    goto LAB_00352060;
  case SE_LineEditContents:
  case SE_FrameContents:
  case SE_ShapedFrameContents:
    if ((rule.b.d.ptr != (QStyleSheetBoxData *)0x0) ||
       ((rule.bd.d.ptr != (QStyleSheetBorderData *)0x0 &&
        ((*(long *)((long)rule.bd.d.ptr + 0x68) != 0 ||
         (*(int *)((long)rule.bd.d.ptr + 0x38) != 0xc)))))) {
      LVar26 = opt->direction;
      btnOpt.super_QStyleOption._0_16_ = QRenderRule::contentsRect(&rule,&opt->rect);
      goto LAB_00352291;
    }
    break;
  case SE_DockWidgetCloseButton:
  case SE_DockWidgetFloatButton:
    iVar29 = (se != SE_DockWidgetCloseButton) + 0x3b;
    memset((QRenderRule *)&btnOpt,0xaa,0x88);
    renderRule((QRenderRule *)&btnOpt,this,&w->super_QObject,opt,iVar29);
    if (btnOpt.icon.d == (QIconPrivate *)0x0) goto LAB_003523f4;
    memset(&subRule,0xaa,0x88);
    renderRule(&subRule,this,&w->super_QObject,opt,0x3a);
    pQVar27 = (QRenderRule *)&btnOpt;
    _local_2c8 = positionRect(this,w,&subRule,pQVar27,iVar29,&opt->rect,opt->direction);
    QRenderRule::~QRenderRule(&subRule);
    goto LAB_003524f8;
  case SE_CheckBoxLayoutItem:
  case SE_ComboBoxLayoutItem:
  case SE_DateTimeEditLayoutItem:
  case SE_LabelLayoutItem:
  case SE_ProgressBarLayoutItem:
  case SE_PushButtonLayoutItem:
  case SE_RadioButtonLayoutItem:
  case SE_SliderLayoutItem:
  case SE_SpinBoxLayoutItem:
  case SE_ToolButtonLayoutItem:
  case SE_FrameLayoutItem:
  case SE_GroupBoxLayoutItem:
  case SE_TabWidgetLayoutItem:
    if ((rule.bd.d.ptr != (QStyleSheetBorderData *)0x0) &&
       ((*(long *)((long)rule.bd.d.ptr + 0x68) != 0 || (*(int *)((long)rule.bd.d.ptr + 0x38) != 0xc)
        ))) goto LAB_00351949;
    break;
  case SE_TabBarTabLeftButton:
  case SE_TabBarTabRightButton:
  case SE_TabBarTabText:
    memset(&subRule,0xaa,0x88);
    renderRule(&subRule,this,&w->super_QObject,opt,0x2e);
    if ((subRule.b.d.ptr == (QStyleSheetBoxData *)0x0) &&
       (((subRule.bd.d.ptr == (QStyleSheetBorderData *)0x0 ||
         ((*(long *)((long)subRule.bd.d.ptr + 0x68) == 0 &&
          (*(int *)((long)subRule.bd.d.ptr + 0x38) == 0xc)))) && (subRule.hasFont != true)))) {
      pQVar27 = &subRule;
      goto LAB_003523f9;
    }
    if ((se == SE_TabBarTabText) &&
       (pQVar19 = qstyleoption_cast<QStyleOptionTab_const*>(opt), pQVar19 != (QStyleOptionTab *)0x0)
       ) {
      this_00 = QtPrivate::qobject_cast_helper<QTabBar_const*,QObject_const>(&w->super_QObject);
      if ((this_00 == (QTabBar *)0x0) || (pQVar19->tabIndex == -1)) {
        subRule2_1._0_16_ = opt->rect;
      }
      else {
        subRule2_1._0_16_ = QTabBar::tabRect(this_00,pQVar19->tabIndex);
      }
      local_2d8 = positionRect(this,w,&subRule,0x2e,(QRect *)&subRule2_1,opt->direction);
      memset((QStyleOptionTab *)&btnOpt,0xaa,0xa0);
      QStyleOptionTab::QStyleOptionTab((QStyleOptionTab *)&btnOpt,pQVar19);
      if (subRule.hasFont == true) {
        local_2b8 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_2b0 = &DAT_aaaaaaaaaaaaaaaa;
        if (w == (QWidget *)0x0) {
          QFont::QFont((QFont *)&local_2b8,&subRule.font);
        }
        else {
          QFont::resolve((QFont *)&local_2b8);
        }
        QFontMetrics::QFontMetrics(local_2e0,(QFont *)&local_2b8);
        uVar23 = btnOpt.super_QStyleOption._32_8_;
        btnOpt.super_QStyleOption.fontMetrics = local_2e0[0];
        btnOpt.super_QStyleOption._33_1_ = local_2e0[1];
        btnOpt.super_QStyleOption._34_1_ = local_2e0[2];
        btnOpt.super_QStyleOption._35_1_ = local_2e0[3];
        btnOpt.super_QStyleOption._36_1_ = local_2e0[4];
        btnOpt.super_QStyleOption._37_1_ = local_2e0[5];
        btnOpt.super_QStyleOption._38_1_ = local_2e0[6];
        btnOpt.super_QStyleOption._39_1_ = local_2e0[7];
        uVar13 = btnOpt.super_QStyleOption._32_8_;
        btnOpt.super_QStyleOption.fontMetrics = SUB81(uVar23,0);
        btnOpt.super_QStyleOption._33_1_ = SUB81(uVar23,1);
        btnOpt.super_QStyleOption._34_1_ = SUB81(uVar23,2);
        btnOpt.super_QStyleOption._35_1_ = SUB81(uVar23,3);
        btnOpt.super_QStyleOption._36_1_ = SUB81(uVar23,4);
        btnOpt.super_QStyleOption._37_1_ = SUB81(uVar23,5);
        btnOpt.super_QStyleOption._38_1_ = SUB81(uVar23,6);
        btnOpt.super_QStyleOption._39_1_ = SUB81(uVar23,7);
        local_2e0[0] = btnOpt.super_QStyleOption.fontMetrics;
        local_2e0[1] = (QFontMetrics)btnOpt.super_QStyleOption._33_1_;
        local_2e0[2] = (QFontMetrics)btnOpt.super_QStyleOption._34_1_;
        local_2e0[3] = (QFontMetrics)btnOpt.super_QStyleOption._35_1_;
        local_2e0[4] = (QFontMetrics)btnOpt.super_QStyleOption._36_1_;
        local_2e0[5] = (QFontMetrics)btnOpt.super_QStyleOption._37_1_;
        local_2e0[6] = (QFontMetrics)btnOpt.super_QStyleOption._38_1_;
        local_2e0[7] = (QFontMetrics)btnOpt.super_QStyleOption._39_1_;
        btnOpt.super_QStyleOption._32_8_ = uVar13;
        QFontMetrics::~QFontMetrics(local_2e0);
        QFont::~QFont((QFont *)&local_2b8);
      }
      btnOpt.super_QStyleOption.rect = QRenderRule::contentsRect(&subRule,&local_2d8);
      _local_2c8 = QWindowsStyle::subElementRect
                             ((QWindowsStyle *)this,SE_TabBarTabText,(QStyleOption *)&btnOpt,w);
      QStyleOptionTab::~QStyleOptionTab((QStyleOptionTab *)&btnOpt);
    }
    else {
      _local_2c8 = QWindowsStyle::subElementRect((QWindowsStyle *)this,se,opt,w);
    }
    pQVar27 = &subRule;
LAB_003524f8:
    QRenderRule::~QRenderRule(pQVar27);
    goto LAB_003524fd;
  case SE_ToolBarHandle:
    bVar14 = hasStyleRule(this,&w->super_QObject,0x21);
    if (!bVar14) break;
    se = SE_ToolBarHandle;
LAB_0035197c:
    _local_2c8 = QWindowsStyle::subElementRect
                           ((QWindowsStyle *)this,se,&pQVar18->super_QStyleOption,w);
    goto LAB_003524fd;
  case SE_TabBarScrollLeftButton:
  case SE_TabBarScrollRightButton:
    bVar14 = hasStyleRule(this,&w->super_QObject,0x2f);
    if (bVar14) goto switchD_00351726_caseD_4;
  }
  pQVar16 = baseStyle(this);
  lVar28 = *(long *)pQVar16;
  pQVar18 = (QStyleOptionButton *)opt;
LAB_00352416:
  _local_2c8 = (QRect)(**(code **)(lVar28 + 0xc0))(pQVar16,se,pQVar18,w);
LAB_003524fd:
  QRenderRule::~QRenderRule(&rule);
  if (pQVar12 == (QStyleSheetStyle *)0x0) {
    globalStyleSheetStyle = (QStyleSheetStyle *)0x0;
  }
LAB_0035251a:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
    return _local_2c8;
  }
  __stack_chk_fail();
}

Assistant:

QRect QStyleSheetStyle::subElementRect(SubElement se, const QStyleOption *opt, const QWidget *w) const
{
    RECURSION_GUARD(return baseStyle()->subElementRect(se, opt, w))

    QRenderRule rule = renderRule(w, opt);
#if QT_CONFIG(tabbar)
    int pe = PseudoElement_None;
#endif

    switch (se) {
    case SE_PushButtonContents:
    case SE_PushButtonBevel:
    case SE_PushButtonFocusRect:
        if (const QStyleOptionButton *btn = qstyleoption_cast<const QStyleOptionButton *>(opt)) {
            if (btn->features & QStyleOptionButton::HasMenu
                && hasStyleRule(w, PseudoElement_PushButtonMenuIndicator)) {
                QStyleOptionButton btnOpt(*btn);
                btnOpt.features &= ~QStyleOptionButton::HasMenu;
                return rule.baseStyleCanDraw() ? baseStyle()->subElementRect(se, &btnOpt, w)
                                               : QWindowsStyle::subElementRect(se, &btnOpt, w);
            }
            if (rule.hasBox() || !rule.hasNativeBorder()) {
                return visualRect(opt->direction, opt->rect, se == SE_PushButtonBevel
                                                                ? rule.borderRect(opt->rect)
                                                                : rule.contentsRect(opt->rect));
            }
            return rule.baseStyleCanDraw() ? baseStyle()->subElementRect(se, btn, w)
                                           : QWindowsStyle::subElementRect(se, btn, w);
        }
        break;

    case SE_LineEditContents:
    case SE_FrameContents:
    case SE_ShapedFrameContents:
        if (rule.hasBox() || !rule.hasNativeBorder()) {
            return visualRect(opt->direction, opt->rect, rule.contentsRect(opt->rect));
        }
        break;

    case SE_CheckBoxIndicator:
    case SE_RadioButtonIndicator:
        if (rule.hasBox() || rule.hasBorder() || hasStyleRule(w, PseudoElement_Indicator)) {
            PseudoElement pe = se == SE_CheckBoxIndicator ? PseudoElement_Indicator : PseudoElement_ExclusiveIndicator;
            QRenderRule subRule = renderRule(w, opt, pe);
            return positionRect(w, rule, subRule, pe, opt->rect, opt->direction);
        }
        break;

    case SE_CheckBoxContents:
    case SE_RadioButtonContents:
        if (rule.hasBox() || rule.hasBorder() || hasStyleRule(w, PseudoElement_Indicator)) {
            bool isRadio = se == SE_RadioButtonContents;
            QRect ir = subElementRect(isRadio ? SE_RadioButtonIndicator : SE_CheckBoxIndicator,
                                      opt, w);
            ir = visualRect(opt->direction, opt->rect, ir);
            int spacing = pixelMetric(isRadio ? PM_RadioButtonLabelSpacing : PM_CheckBoxLabelSpacing, nullptr, w);
            QRect cr = rule.contentsRect(opt->rect);
            ir.setRect(ir.left() + ir.width() + spacing, cr.y(),
                       cr.width() - ir.width() - spacing, cr.height());
            return visualRect(opt->direction, opt->rect, ir);
        }
        break;

    case SE_ToolBoxTabContents:
        if (w && hasStyleRule(w->parentWidget(), PseudoElement_ToolBoxTab)) {
            QRenderRule subRule = renderRule(w->parentWidget(), opt, PseudoElement_ToolBoxTab);
            return visualRect(opt->direction, opt->rect, subRule.contentsRect(opt->rect));
        }
        break;

    case SE_RadioButtonFocusRect:
    case SE_RadioButtonClickRect: // focusrect | indicator
        if (rule.hasBox() || rule.hasBorder() || hasStyleRule(w, PseudoElement_Indicator)) {
            return opt->rect;
        }
        break;

    case SE_CheckBoxFocusRect:
    case SE_CheckBoxClickRect: // relies on indicator and contents
        return ParentStyle::subElementRect(se, opt, w);

#if QT_CONFIG(itemviews)
    case SE_ItemViewItemCheckIndicator:
        if (!qstyleoption_cast<const QStyleOptionViewItem *>(opt)) {
            return subElementRect(SE_CheckBoxIndicator, opt, w);
        }
        Q_FALLTHROUGH();
    case SE_ItemViewItemText:
    case SE_ItemViewItemDecoration:
    case SE_ItemViewItemFocusRect:
        if (const QStyleOptionViewItem *vopt = qstyleoption_cast<const QStyleOptionViewItem *>(opt)) {
            QRenderRule subRule = renderRule(w, opt, PseudoElement_ViewItem);
            PseudoElement pe = PseudoElement_None;
            if (se == SE_ItemViewItemText || se == SE_ItemViewItemFocusRect)
                pe = PseudoElement_ViewItemText;
            else if (se == SE_ItemViewItemDecoration && vopt->features & QStyleOptionViewItem::HasDecoration)
                pe = PseudoElement_ViewItemIcon;
            else if (se == SE_ItemViewItemCheckIndicator && vopt->features & QStyleOptionViewItem::HasCheckIndicator)
                pe = PseudoElement_ViewItemIndicator;
            else
                break;
            if (subRule.hasGeometry() || subRule.hasBox() || !subRule.hasNativeBorder() || hasStyleRule(w, pe)) {
                QRenderRule subRule2 = renderRule(w, opt, pe);
                QStyleOptionViewItem optCopy(*vopt);
                optCopy.rect = subRule.contentsRect(vopt->rect);
                QRect rect = ParentStyle::subElementRect(se, &optCopy, w);
                return positionRect(w, subRule2, pe, rect, opt->direction);
            }
         }
        break;
#endif // QT_CONFIG(itemviews)

    case SE_HeaderArrow: {
        QRenderRule subRule = renderRule(w, opt, PseudoElement_HeaderViewUpArrow);
        if (subRule.hasPosition() || subRule.hasGeometry())
            return positionRect(w, rule, subRule, PseudoElement_HeaderViewUpArrow, opt->rect, opt->direction);
                         }
        break;

    case SE_HeaderLabel: {
        QRenderRule subRule = renderRule(w, opt, PseudoElement_HeaderViewSection);
        if (subRule.hasBox() || !subRule.hasNativeBorder()) {
            auto r = subRule.contentsRect(opt->rect);
            if (const QStyleOptionHeader *header = qstyleoption_cast<const QStyleOptionHeader *>(opt)) {
                // Subtract width needed for arrow, if there is one
                if (header->sortIndicator != QStyleOptionHeader::None) {
                    const auto arrowRect = subElementRect(SE_HeaderArrow, opt, w);
                    if (arrowRect.isValid()) {
                        if (opt->state & State_Horizontal)
                            r.setWidth(r.width() - arrowRect.width());
                        else
                            r.setHeight(r.height() - arrowRect.height());
                    }
                }
            }
            return r;
        }
                         }
        break;

    case SE_ProgressBarGroove:
    case SE_ProgressBarContents:
    case SE_ProgressBarLabel:
        if (const QStyleOptionProgressBar *pb = qstyleoption_cast<const QStyleOptionProgressBar *>(opt)) {
            if (rule.hasBox() || !rule.hasNativeBorder() || rule.hasPosition() || hasStyleRule(w, PseudoElement_ProgressBarChunk)) {
                if (se == SE_ProgressBarGroove)
                    return rule.borderRect(pb->rect);
                else if (se == SE_ProgressBarContents)
                    return rule.contentsRect(pb->rect);

                QSize sz = pb->fontMetrics.size(0, pb->text);
                return QStyle::alignedRect(Qt::LeftToRight, rule.hasPosition() ? rule.position()->textAlignment : pb->textAlignment,
                                           sz, pb->rect);
            }
        }
        break;

#if QT_CONFIG(tabbar)
    case SE_TabWidgetLeftCorner:
        pe = PseudoElement_TabWidgetLeftCorner;
        Q_FALLTHROUGH();
    case SE_TabWidgetRightCorner:
        if (pe == PseudoElement_None)
            pe = PseudoElement_TabWidgetRightCorner;
        Q_FALLTHROUGH();
    case SE_TabWidgetTabBar:
        if (pe == PseudoElement_None)
            pe = PseudoElement_TabWidgetTabBar;
        Q_FALLTHROUGH();
    case SE_TabWidgetTabPane:
    case SE_TabWidgetTabContents:
        if (pe == PseudoElement_None)
            pe = PseudoElement_TabWidgetPane;

        if (hasStyleRule(w, pe)) {
            QRect r = QWindowsStyle::subElementRect(pe == PseudoElement_TabWidgetPane ? SE_TabWidgetTabPane : se, opt, w);
            QRenderRule subRule = renderRule(w, opt, pe);
            r = positionRect(w, subRule, pe, r, opt->direction);
            if (pe == PseudoElement_TabWidgetTabBar) {
                Q_ASSERT(opt);
                r = opt->rect.intersected(r);
            }
            if (se == SE_TabWidgetTabContents)
                r = subRule.contentsRect(r);
            return r;
        }
        break;

    case SE_TabBarScrollLeftButton:
    case SE_TabBarScrollRightButton:
        if (hasStyleRule(w, PseudoElement_TabBarScroller))
            return ParentStyle::subElementRect(se, opt, w);
        break;

    case SE_TabBarTearIndicator: {
        QRenderRule subRule = renderRule(w, opt, PseudoElement_TabBarTear);
        if (subRule.hasContentsSize()) {
            QRect r;
            if (const QStyleOptionTab *tab = qstyleoption_cast<const QStyleOptionTab *>(opt)) {
                switch (tab->shape) {
                case QTabBar::RoundedNorth:
                case QTabBar::TriangularNorth:
                case QTabBar::RoundedSouth:
                case QTabBar::TriangularSouth:
                    r.setRect(tab->rect.left(), tab->rect.top(), subRule.size().width(), opt->rect.height());
                    break;
                case QTabBar::RoundedWest:
                case QTabBar::TriangularWest:
                case QTabBar::RoundedEast:
                case QTabBar::TriangularEast:
                    r.setRect(tab->rect.left(), tab->rect.top(), opt->rect.width(), subRule.size().height());
                    break;
                default:
                    break;
                }
                r = visualRect(opt->direction, opt->rect, r);
            }
            return r;
        }
        break;
    }
    case SE_TabBarTabText:
    case SE_TabBarTabLeftButton:
    case SE_TabBarTabRightButton: {
        QRenderRule subRule = renderRule(w, opt, PseudoElement_TabBarTab);
        if (subRule.hasBox() || !subRule.hasNativeBorder() || subRule.hasFont) {
            if (se == SE_TabBarTabText) {
                if (const QStyleOptionTab *tab = qstyleoption_cast<const QStyleOptionTab *>(opt)) {
                    const QTabBar *bar = qobject_cast<const QTabBar *>(w);
                    const QRect optRect = bar && tab->tabIndex != -1 ? bar->tabRect(tab->tabIndex) : opt->rect;
                    const QRect r = positionRect(w, subRule, PseudoElement_TabBarTab, optRect, opt->direction);
                    QStyleOptionTab tabCopy(*tab);
                    if (subRule.hasFont) {
                        const QFont ruleFont = w ? subRule.font.resolve(w->font()) : subRule.font;
                        tabCopy.fontMetrics = QFontMetrics(ruleFont);
                    }
                    tabCopy.rect = subRule.contentsRect(r);
                    return ParentStyle::subElementRect(se, &tabCopy, w);
                }
            }
            return ParentStyle::subElementRect(se, opt, w);
        }
        break;
    }
#endif // QT_CONFIG(tabbar)

    case SE_DockWidgetCloseButton:
    case SE_DockWidgetFloatButton: {
        PseudoElement pe = (se == SE_DockWidgetCloseButton) ? PseudoElement_DockWidgetCloseButton : PseudoElement_DockWidgetFloatButton;
        QRenderRule subRule2 = renderRule(w, opt, pe);
        if (!subRule2.hasPosition())
            break;
        QRenderRule subRule = renderRule(w, opt, PseudoElement_DockWidgetTitle);
        return positionRect(w, subRule, subRule2, pe, opt->rect, opt->direction);
                                   }

#if QT_CONFIG(toolbar)
    case SE_ToolBarHandle:
        if (hasStyleRule(w, PseudoElement_ToolBarHandle))
            return ParentStyle::subElementRect(se, opt, w);
        break;
#endif // QT_CONFIG(toolbar)

    // On mac we make pixel adjustments to layouts which are not
    // desirable when you have custom style sheets on them
    case SE_CheckBoxLayoutItem:
    case SE_ComboBoxLayoutItem:
    case SE_DateTimeEditLayoutItem:
    case SE_LabelLayoutItem:
    case SE_ProgressBarLayoutItem:
    case SE_PushButtonLayoutItem:
    case SE_RadioButtonLayoutItem:
    case SE_SliderLayoutItem:
    case SE_SpinBoxLayoutItem:
    case SE_ToolButtonLayoutItem:
    case SE_FrameLayoutItem:
    case SE_GroupBoxLayoutItem:
    case SE_TabWidgetLayoutItem:
        if (!rule.hasNativeBorder())
            return opt->rect;
        break;

    default:
        break;
    }

    return baseStyle()->subElementRect(se, opt, w);
}